

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O2

bool __thiscall ScapeGoatTree::removeBST(ScapeGoatTree *this,int value)

{
  Node *pNVar1;
  Node *parent;
  Node *location;
  
  if (this->root == (Node *)0x0) {
    return false;
  }
  find(this,value,&parent,&location);
  if (location == (Node *)0x0) {
    return false;
  }
  if (location->leftChild == (Node *)0x0) {
    if (location->rightChild == (Node *)0x0) {
      pNVar1 = (Node *)this;
      if ((parent != (Node *)0x0) &&
         (pNVar1 = (Node *)&parent->leftChild, parent->leftChild != location)) {
        pNVar1 = parent;
      }
      pNVar1->rightChild = (Node *)0x0;
      if (location->leftChild != (Node *)0x0) goto LAB_001077d7;
LAB_00107827:
      if (location->rightChild == (Node *)0x0) goto LAB_0010785a;
    }
    caseB(this,parent,location);
    if (location->leftChild == (Node *)0x0) goto LAB_0010785a;
LAB_00107844:
    if (location->rightChild == (Node *)0x0) goto LAB_0010785a;
  }
  else {
LAB_001077d7:
    if (location->rightChild == (Node *)0x0) {
      caseB(this,parent,location);
      if (location->leftChild == (Node *)0x0) goto LAB_00107827;
      goto LAB_00107844;
    }
  }
  caseC(this,parent,location);
LAB_0010785a:
  operator_delete(location,0x20);
  return true;
}

Assistant:

bool ScapeGoatTree::removeBST(int value) {
    Node *parent, *location;
    if (root == nullptr) {
        return false;
    }
    find(value, &parent, &location);
    if (location == nullptr) {
        return false;
    }
    if (location->leftChild == nullptr && location->rightChild == nullptr) {
        caseA(parent, location);
    }
    if (location->leftChild != nullptr && location->rightChild == nullptr) {
        caseB(parent, location);
    }
    if (location->leftChild == nullptr && location->rightChild != nullptr) {
        caseB(parent, location);
    }
    if (location->leftChild != nullptr && location->rightChild != nullptr) {
        caseC(parent, location);
    }
    delete location;
    return true;
}